

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O0

void duckdb::StrpTimeFunction::TryParse<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  bool bVar2;
  anon_class_8_1_898d11ac fun;
  reference pvVar3;
  Vector *in_RDX;
  Vector *in_RSI;
  DataChunk *in_RDI;
  BaseExpression *unaff_retaddr;
  bool in_stack_0000000f;
  Vector *in_stack_00000010;
  StrpTimeBindData *info;
  BoundFunctionExpression *func_expr;
  idx_t in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  
  BaseExpression::Cast<duckdb::BoundFunctionExpression>(unaff_retaddr);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffffc0);
  fun.info = FunctionData::Cast<duckdb::StrpTimeBindData>((FunctionData *)in_stack_ffffffffffffffc0)
  ;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VVar1 = Vector::GetVectorType(pvVar3);
  if (VVar1 == CONSTANT_VECTOR) {
    vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    bVar2 = ConstantVector::IsNull((Vector *)0x11f1ae6);
    if (bVar2) {
      Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
      ConstantVector::SetNull(in_stack_00000010,in_stack_0000000f);
      return;
    }
  }
  pvVar3 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  DataChunk::size(in_RDI);
  UnaryExecutor::
  ExecuteWithNulls<duckdb::string_t,duckdb::timestamp_t,duckdb::StrpTimeFunction::TryParse<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::ValidityMask&,unsigned_long)_1_>
            (in_RDX,pvVar3,in_stack_ffffffffffffffb8,fun);
  return;
}

Assistant:

static void TryParse(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<StrpTimeBindData>();

		if (args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR && ConstantVector::IsNull(args.data[1])) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		UnaryExecutor::ExecuteWithNulls<string_t, T>(args.data[0], result, args.size(),
		                                             [&](string_t input, ValidityMask &mask, idx_t idx) {
			                                             T result;
			                                             string error;
			                                             for (auto &format : info.formats) {
				                                             if (StrpTimeTryResult(format, input, result, error)) {
					                                             return result;
				                                             }
			                                             }

			                                             mask.SetInvalid(idx);
			                                             return T();
		                                             });
	}